

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::AnyMetadata::InternalIs(AnyMetadata *this,StringPiece type_name)

{
  char cVar1;
  stringpiece_ssize_type sVar2;
  stringpiece_ssize_type sVar3;
  StringPiece type_url;
  StringPiece *in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff78;
  undefined1 uVar4;
  byte bVar5;
  undefined4 in_stack_ffffffffffffff7c;
  string *in_stack_ffffffffffffff80;
  string local_78 [39];
  byte local_51;
  string local_50 [32];
  StringPiece local_30;
  StringPiece local_18;
  byte local_1;
  
  local_30 = anon_unknown_7::Get<google::protobuf::internal::ArenaStringPtr>
                       ((ArenaStringPtr *)0x48671f);
  sVar2 = StringPiece::size(&local_30);
  sVar3 = StringPiece::size(&local_18);
  local_51 = 0;
  bVar5 = 0;
  uVar4 = false;
  if (sVar3 + 1 <= sVar2) {
    sVar2 = StringPiece::size(&local_30);
    sVar3 = StringPiece::size(&local_18);
    cVar1 = StringPiece::operator[](&local_30,(sVar2 - sVar3) + -1);
    uVar4 = false;
    if (cVar1 == '/') {
      StringPiece::operator_cast_to_string(in_stack_ffffffffffffff58);
      local_51 = 1;
      StringPiece::operator_cast_to_string(in_stack_ffffffffffffff58);
      bVar5 = 1;
      uVar4 = HasSuffixString(in_stack_ffffffffffffff80,
                              (string *)
                              CONCAT44(in_stack_ffffffffffffff7c,
                                       CONCAT13(1,CONCAT12(uVar4,in_stack_ffffffffffffff78))));
    }
  }
  local_1 = uVar4;
  if ((bVar5 & 1) != 0) {
    std::__cxx11::string::~string(local_78);
  }
  if ((local_51 & 1) != 0) {
    std::__cxx11::string::~string(local_50);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool AnyMetadata::InternalIs(StringPiece type_name) const {
  StringPiece type_url = Get(type_url_);
  return type_url.size() >= type_name.size() + 1 &&
         type_url[type_url.size() - type_name.size() - 1] == '/' &&
         HasSuffixString(type_url, type_name);
}